

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O3

bool __thiscall fmcalc::init_itemtotiv(fmcalc *this)

{
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *this_00;
  pointer pvVar1;
  pointer psVar2;
  pointer pfVar3;
  bool bVar4;
  long *plVar5;
  FILE *__stream;
  ulong uVar6;
  size_t sVar7;
  _Rb_tree_node_base *p_Var8;
  undefined8 extraout_RAX;
  long *plVar9;
  ulong uVar10;
  pointer pvVar11;
  long lVar12;
  int level;
  long lVar13;
  _Rb_tree_node_base *p_Var14;
  long lVar15;
  float fVar16;
  item itm;
  string file;
  vector<float,_std::allocator<float>_> coverages;
  undefined8 local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  undefined1 local_c8 [40];
  ulong local_a0;
  vector<float,_std::allocator<float>_> local_98;
  int *local_80 [2];
  int local_70 [4];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar4 = loadcoverages(this,&local_98);
  if (bVar4) {
    local_c8._0_8_ = local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"input/items.bin","");
    if ((this->inputpath_)._M_string_length != 0) {
      std::__cxx11::string::substr((ulong)local_80,(ulong)local_c8);
      plVar5 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_80,0,(char *)0x0,
                                  (ulong)(this->inputpath_)._M_dataplus._M_p);
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_d8 = *plVar9;
        lStack_d0 = plVar5[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar9;
        local_e8 = (long *)*plVar5;
      }
      local_e0 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_c8,(string *)&local_e8);
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0]);
      }
    }
    __stream = fopen((char *)local_c8._0_8_,"rb");
    if (__stream == (FILE *)0x0) {
LAB_001051d7:
      init_itemtotiv((fmcalc *)local_c8);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0]);
      }
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_);
      }
      if ((pointer)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(extraout_RAX);
    }
    fseek(__stream,0,2);
    uVar6 = ftell(__stream);
    fseek(__stream,0,0);
    uVar6 = (ulong)((int)((uVar6 & 0xffffffff) / 0x14) + 1);
    local_e8 = (long *)((ulong)local_e8 & 0xffffffff00000000);
    std::vector<float,_std::allocator<float>_>::resize
              (&this->item_to_tiv_,uVar6,(value_type_conflict2 *)&local_e8);
    local_e8 = (long *)((ulong)local_e8 & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::resize
              (&this->item_to_cov_id_,uVar6,(value_type_conflict1 *)&local_e8);
    lVar12 = 1;
    sVar7 = fread(&local_e8,0x14,1,__stream);
    if (sVar7 != 0) {
      do {
        if ((value_type_conflict2)lVar12 != (value_type_conflict2)local_e8) {
          init_itemtotiv();
          goto LAB_001051d7;
        }
        (this->item_to_tiv_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[lVar12] =
             *(float *)((long)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)local_98.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->_M_impl).
                               super__Vector_impl_data._M_start + (long)local_e8._4_4_ * 4);
        (this->item_to_cov_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar12] = local_e8._4_4_;
        sVar7 = fread(&local_e8,0x14,1,__stream);
        lVar12 = lVar12 + 1;
      } while (sVar7 != 0);
    }
    fclose(__stream);
    pvVar1 = (this->node_to_direct_sub_nodes_vec_).
             super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    level = (int)((ulong)((long)(this->node_to_direct_sub_nodes_vec_).
                                super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) >> 3) *
            -0x55555555 + -1;
    if (1 < (ulong)(((long)*(pointer *)
                            ((long)&pvVar1[level].
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data + 8) -
                     *(long *)&pvVar1[level].
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555)) {
      uVar6 = 1;
      do {
        assign_coverage_ids((set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,this,level,
                            (int)uVar6);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_60);
        pvVar1 = (this->node_to_direct_sub_nodes_vec_).
                 super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = uVar6 + 1;
        uVar10 = ((long)*(pointer *)
                         ((long)&pvVar1[level].
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data + 8) -
                  *(long *)&pvVar1[level].
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555;
      } while (uVar6 <= uVar10 && uVar10 - uVar6 != 0);
    }
    this_00 = &this->accumulated_tivs_;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(this_00,((long)(this->node_to_coverage_ids_).
                            super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->node_to_coverage_ids_).
                            super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    pvVar11 = (this->node_to_coverage_ids_).
              super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->node_to_coverage_ids_).
        super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pvVar11) {
      uVar6 = 0;
      do {
        std::vector<float,_std::allocator<float>_>::resize
                  ((this_00->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar6,
                   ((long)pvVar11[uVar6].
                          super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)pvVar11[uVar6].
                          super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
        pfVar3 = local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_c8._32_8_ =
             (this->node_to_coverage_ids_).
             super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        psVar2 = (((pointer)(local_c8._32_8_ + uVar6 * 0x18))->
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar12 = (long)(((pointer)(local_c8._32_8_ + uVar6 * 0x18))->
                       super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)psVar2;
        local_a0 = uVar6;
        if (lVar12 != 0) {
          lVar15 = (lVar12 >> 4) * -0x5555555555555555;
          lVar12 = *(long *)&(this_00->
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar6].
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data;
          lVar13 = 0;
          do {
            *(undefined4 *)(lVar12 + lVar13 * 4) = 0;
            p_Var14 = &psVar2[lVar13]._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var8 = *(_Base_ptr *)((long)&psVar2[lVar13]._M_t._M_impl.super__Rb_tree_header + 0x10)
            ;
            if (p_Var8 != p_Var14) {
              fVar16 = 0.0;
              do {
                fVar16 = fVar16 + *(float *)((long)&(((
                                                  _Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  *)pfVar3)->_M_impl).super__Vector_impl_data.
                                                  _M_start + (long)(int)p_Var8[1]._M_color * 4);
                *(float *)(lVar12 + lVar13 * 4) = fVar16;
                p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
              } while (p_Var8 != p_Var14);
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != lVar15 + (ulong)(lVar15 == 0));
        }
        uVar6 = local_a0 + 1;
        uVar10 = ((long)(this->node_to_coverage_ids_).
                        super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - local_c8._32_8_ >> 3) *
                 -0x5555555555555555;
        pvVar11 = (pointer)local_c8._32_8_;
      } while (uVar6 <= uVar10 && uVar10 - uVar6 != 0);
    }
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_);
    }
  }
  if ((pointer)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool fmcalc::init_itemtotiv()
{
	std::vector<OASIS_FLOAT> coverages;
	bool has_coverage = loadcoverages(coverages);
	if (!has_coverage) return false;

	FILE *fin = NULL;
	std::string file = ITEMS_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);
	flseek(fin, 0L, SEEK_SET);
	int last_item_id = 0;

	unsigned int nrec = (unsigned int)sz / (unsigned int)sizeof(item);
	item_to_tiv_.resize(nrec + 1, 0.0);
	item_to_cov_id_.resize(nrec + 1, 0);

	item itm;
	size_t i = fread(&itm, sizeof(itm), 1, fin);
	while (i != 0) {
		last_item_id++;
		if (itm.id != last_item_id) {
			fprintf(stderr, "FATAL: Item ids are not contiguous or do not start from one");
			exit(-1);
		}
		last_item_id = itm.id;
        item_to_tiv_[itm.id] = coverages[itm.coverage_id];
        item_to_cov_id_[itm.id] = itm.coverage_id;
		i = fread(&itm, sizeof(itm), 1, fin);
	}
	fclose(fin);

	// Calculate accumulated TIV
	int final_level = node_to_direct_sub_nodes_vec_.size() - 1;
	for (int i = 1; i < node_to_direct_sub_nodes_vec_[final_level].size(); i++) {
		assign_coverage_ids(final_level, i);
	}
	accumulated_tivs_.resize(node_to_coverage_ids_.size());
	for (int i = 0; i < node_to_coverage_ids_.size(); i++) {
		accumulated_tivs_[i].resize(node_to_coverage_ids_[i].size());
		for (int j = 0; j < node_to_coverage_ids_[i].size(); j++) {
			accumulated_tivs_[i][j] = 0;
			for (std::set<int>::iterator k = node_to_coverage_ids_[i][j].begin();
					k != node_to_coverage_ids_[i][j].end(); k++) {
				accumulated_tivs_[i][j] += coverages[*k];
			}
		}
	}
	return true;

}